

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O1

bool duckdb::TrySimpleIntegerCast<int,true>(char *buf,idx_t len,int *result,bool strict)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  undefined7 in_register_00000009;
  undefined8 uVar5;
  idx_t iVar6;
  int iVar7;
  int iVar8;
  char cVar9;
  uint uVar10;
  char *pcVar11;
  byte bVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  IntegerCastData<short> local_6a;
  IntegerDecimalCastData<int> local_68;
  ulong local_48;
  int *local_40;
  ulong local_38;
  
  uVar5 = CONCAT71(in_register_00000009,strict);
  iVar4 = (int)uVar5;
  if (len != 0) {
    iVar7 = 3;
    uVar14 = 0;
    do {
      bVar1 = buf[uVar14];
      uVar5 = CONCAT71((int7)((ulong)uVar5 >> 8),bVar1);
      iVar4 = (int)uVar5;
      uVar10 = (uint)bVar1;
      if ((4 < uVar10 - 9) && (uVar10 != 0x20)) {
        if (uVar10 == 0x2d) {
          uVar16 = len - uVar14;
          iVar4 = 0;
          bVar19 = false;
          uVar15 = 1;
          goto LAB_00cee79b;
        }
        if (bVar1 != 0x30 || len - 1 == uVar14) {
LAB_00cee9d6:
          uVar16 = len - uVar14;
          local_48 = (ulong)(bVar1 == 0x2b);
          iVar4 = 0;
          uVar15 = local_48;
          goto LAB_00cee9f0;
        }
        cVar9 = buf[uVar14 + 1];
        if (cVar9 != 'B') {
          if (cVar9 != 'x') {
            if (cVar9 == 'b') goto LAB_00ceecf4;
            if (cVar9 != 'X') goto LAB_00cee9d6;
          }
          iVar4 = 0;
          uVar15 = 1;
          goto LAB_00cee8cf;
        }
LAB_00ceecf4:
        uVar15 = ~uVar14 + len;
        iVar4 = 0;
        bVar19 = uVar15 >= 2;
        if (uVar15 < 2) goto LAB_00cee829;
        uVar16 = 1;
        iVar4 = 0;
        goto LAB_00ceed10;
      }
      uVar14 = uVar14 + 1;
    } while (len != uVar14);
  }
  bVar19 = false;
  goto LAB_00cee829;
  while( true ) {
    uVar13 = uVar15 + 1;
    if (iVar4 < (int)(bVar1 + 0x80000000) / 10) {
      bVar18 = false;
    }
    else {
      iVar4 = iVar4 * 10 - (uint)bVar1;
      bVar18 = true;
      if ((~uVar15 + len != uVar14) && (buf[uVar14 + 1 + uVar15] == '_')) {
        uVar13 = uVar15 + 2;
        if ((len - uVar15) - 2 == uVar14) {
          bVar18 = false;
        }
        else {
          bVar18 = (byte)(buf[uVar14 + uVar13] - 0x30U) < 10;
        }
      }
    }
    uVar15 = uVar13;
    if (!bVar18) break;
LAB_00cee79b:
    if (uVar16 <= uVar15) goto LAB_00ceefdf;
    bVar1 = buf[uVar14 + uVar15] - 0x30;
    if (9 < bVar1) {
      if (buf[uVar14 + uVar15] == '.') {
        uVar13 = uVar15 + 1;
        if (uVar13 < uVar16) {
          iVar7 = 0;
          if (9 < (byte)(buf[uVar14 + 1 + uVar15] - 0x30U)) goto LAB_00ceef70;
          iVar8 = 1;
        }
        else {
          iVar7 = 3;
LAB_00ceef70:
          iVar8 = 1;
          if (1 < uVar15) {
            iVar8 = iVar7;
          }
        }
        uVar15 = uVar13;
        if (iVar8 == 3) goto LAB_00ceefdf;
        if (iVar8 != 0) goto LAB_00cef054;
      }
      bVar19 = false;
      if (((ulong)(byte)buf[uVar14 + uVar15] < 0x21) &&
         ((0x100003e00U >> ((ulong)(byte)buf[uVar14 + uVar15] & 0x3f) & 1) != 0)) {
        uVar13 = uVar15 + 1;
        uVar15 = uVar13;
        if (uVar16 <= uVar13) goto LAB_00ceefdf;
        goto LAB_00ceefb3;
      }
      break;
    }
  }
  goto LAB_00cee829;
  while (uVar13 = uVar13 + 1, uVar15 = uVar16, uVar16 != uVar13) {
LAB_00ceefb3:
    if ((0x20 < (ulong)(byte)buf[uVar14 + uVar13]) ||
       ((0x100003e00U >> ((ulong)(byte)buf[uVar14 + uVar13] & 0x3f) & 1) == 0)) goto LAB_00cef054;
  }
LAB_00ceefdf:
  bVar19 = 1 < uVar15;
  goto LAB_00cee829;
  while( true ) {
    uVar13 = uVar15 + 1;
    bVar18 = false;
    if (iVar4 <= (int)(((ulong)uVar10 & 0xffffffff000000ff ^ 0x7ffffffe) / 10)) {
      iVar4 = iVar4 * 10 + (uVar10 & 0xff);
      bVar18 = true;
      if ((~uVar15 + len != uVar14) && (buf[uVar14 + 1 + uVar15] == '_')) {
        uVar13 = uVar15 + 2;
        if ((len - uVar15) - 2 == uVar14) {
          bVar18 = false;
        }
        else {
          bVar18 = (byte)(buf[uVar14 + uVar13] - 0x30U) < 10;
        }
      }
    }
    bVar19 = false;
    uVar15 = uVar13;
    if (!bVar18) break;
LAB_00cee9f0:
    if (uVar16 <= uVar15) goto LAB_00cef048;
    uVar10 = (byte)buf[uVar14 + uVar15] - 0x30;
    if (9 < (byte)uVar10) {
      if (buf[uVar14 + uVar15] == 0x2e) {
        uVar13 = uVar15 + 1;
        if ((uVar13 < uVar16) && (iVar7 = 0, (byte)(buf[uVar14 + 1 + uVar15] - 0x30U) < 10)) {
          iVar8 = 1;
        }
        else {
          iVar8 = 1;
          if (local_48 < uVar15) {
            iVar8 = iVar7;
          }
        }
        uVar15 = uVar13;
        if (iVar8 == 3) goto LAB_00cef048;
        if (iVar8 != 0) goto LAB_00cef054;
      }
      bVar19 = false;
      if (((ulong)(byte)buf[uVar14 + uVar15] < 0x21) &&
         ((0x100003e00U >> ((ulong)(byte)buf[uVar14 + uVar15] & 0x3f) & 1) != 0)) {
        uVar13 = uVar15 + 1;
        uVar15 = uVar13;
        if (uVar16 <= uVar13) goto LAB_00cef048;
        goto LAB_00cef028;
      }
      break;
    }
  }
  goto LAB_00cee829;
  while (uVar13 = uVar13 + 1, uVar15 = uVar16, uVar16 != uVar13) {
LAB_00cef028:
    if ((0x20 < (ulong)(byte)buf[uVar14 + uVar13]) ||
       ((0x100003e00U >> ((ulong)(byte)buf[uVar14 + uVar13] & 0x3f) & 1) == 0)) goto LAB_00cef054;
  }
LAB_00cef048:
  bVar19 = local_48 < uVar15;
  goto LAB_00cee829;
LAB_00cee8cf:
  do {
    if (~uVar14 + len <= uVar15) goto LAB_00ceefdf;
    bVar1 = buf[uVar14 + 1 + uVar15];
    bVar12 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar12 = bVar1;
    }
    if (9 < (byte)(bVar12 - 0x30)) {
      bVar19 = false;
      if ((0x25 < bVar12 - 0x41) || ((0x3f0000003fU >> ((ulong)(bVar12 - 0x41) & 0x3f) & 1) == 0))
      break;
    }
    cVar9 = -0x57;
    if ((char)bVar12 < 'a') {
      cVar9 = -0x30;
    }
    uVar16 = uVar15 + 1;
    if (((len - uVar15) - 2 == uVar14) || (buf[uVar14 + 2 + uVar15] != '_')) {
LAB_00cee99d:
      uVar10 = (byte)(cVar9 + bVar12) >> 4 ^ 0x7ffffff;
      iVar7 = iVar4;
      if (iVar4 <= (int)uVar10) {
        iVar7 = iVar4 * 0x10 + (uint)(byte)(cVar9 + bVar12);
      }
      bVar18 = iVar4 <= (int)uVar10;
      iVar4 = iVar7;
    }
    else {
      uVar16 = uVar15 + 2;
      if ((len - uVar15) - 3 != uVar14) {
        if (9 < (byte)(buf[uVar14 + 3 + uVar15] - 0x30U)) {
          uVar10 = (byte)buf[uVar14 + 3 + uVar15] - 0x41;
          bVar18 = false;
          if ((0x25 < uVar10) ||
             (bVar18 = false, (0x3f0000003fU >> ((ulong)uVar10 & 0x3f) & 1) == 0))
          goto LAB_00cee9c5;
        }
        goto LAB_00cee99d;
      }
      bVar18 = false;
    }
LAB_00cee9c5:
    bVar19 = false;
    uVar15 = uVar16;
  } while (bVar18);
  goto LAB_00cee829;
LAB_00cef054:
  bVar19 = false;
  goto LAB_00cee829;
  while( true ) {
    bVar1 = buf[uVar14 + uVar16] - 0x30;
    if (9 < bVar1) {
      if (buf[uVar14 + uVar16] != '.') goto LAB_00cef274;
      uVar13 = uVar16 + 1;
      if (uVar15 <= uVar13) {
        iVar4 = 3;
        uVar17 = uVar13;
        goto LAB_00cef24e;
      }
      local_68.decimal = 0;
      uVar3 = uVar13;
      goto LAB_00ceeee0;
    }
    uVar13 = uVar16 + 1;
    if (local_68.result < (long)((ulong)bVar1 + 0x8000000000000000) / 10) {
      bVar19 = false;
    }
    else {
      local_68.result = local_68.result * 10 - (ulong)bVar1;
      bVar19 = true;
      if ((~uVar16 + len != uVar14) && (buf[uVar14 + 1 + uVar16] == '_')) {
        uVar13 = uVar16 + 2;
        if ((len - uVar16) - 2 == uVar14) {
          bVar19 = false;
        }
        else {
          bVar19 = (byte)(buf[uVar14 + uVar13] - 0x30U) < 10;
        }
      }
    }
    uVar16 = uVar13;
    if (!bVar19) break;
LAB_00ceeab9:
    if (uVar15 <= uVar16) goto LAB_00ceee96;
  }
  goto LAB_00cee860;
  while (uVar3 = uVar17, uVar17 < uVar15) {
LAB_00ceeee0:
    bVar1 = buf[uVar14 + uVar3] - 0x30;
    local_48 = uVar13;
    if (9 < bVar1) {
      iVar4 = 0;
      goto LAB_00cef23f;
    }
    if (local_68.decimal <= (long)(((ulong)bVar1 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.decimal_digits = local_68.decimal_digits + 1;
      local_68.decimal = local_68.decimal * 10 + (ulong)bVar1;
    }
    uVar17 = uVar3 + 1;
    if (((~uVar3 + len != uVar14) && (buf[uVar14 + 1 + uVar3] == '_')) &&
       ((uVar17 = uVar3 + 2, (len - uVar3) - 2 == uVar14 ||
        (9 < (byte)(buf[uVar14 + uVar17] - 0x30U))))) {
      local_68._18_6_ = 0;
      iVar7 = 1;
      goto LAB_00cef263;
    }
  }
  iVar4 = 3;
LAB_00cef23f:
  local_68._18_6_ = 0;
  uVar17 = uVar3;
LAB_00cef24e:
  iVar7 = 1;
  if (uVar13 < uVar17) {
    iVar7 = iVar4;
  }
  if (1 < uVar16) {
    iVar7 = iVar4;
  }
LAB_00cef263:
  uVar16 = uVar17;
  if (iVar7 == 3) {
LAB_00ceee96:
    bVar19 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,true>
                       (&local_68);
    if (bVar19) {
      bVar19 = 1 < uVar16;
      goto LAB_00cee862;
    }
  }
  else if (iVar7 == 0) {
LAB_00cef274:
    bVar1 = buf[uVar14 + uVar16];
    if (bVar1 - 9 < 5) {
LAB_00cef286:
      uVar13 = uVar16 + 1;
      uVar16 = uVar13;
      if (uVar13 < uVar15) {
        do {
          if ((0x20 < (ulong)(byte)buf[uVar14 + uVar13]) ||
             ((0x100003e00U >> ((ulong)(byte)buf[uVar14 + uVar13] & 0x3f) & 1) == 0))
          goto LAB_00cee860;
          uVar13 = uVar13 + 1;
          uVar16 = uVar15;
        } while (uVar15 != uVar13);
      }
      goto LAB_00ceee96;
    }
    if ((bVar1 == 0x65) || (bVar1 == 0x45)) {
      if ((uVar16 != 1) && (uVar16 + 1 < uVar15)) {
        local_6a.result = 0;
        pcVar11 = buf + uVar14 + uVar16 + 1;
        iVar6 = ~uVar14 + (len - uVar16);
        if (*pcVar11 == '-') {
          bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar11,iVar6,&local_6a,SUB81(iVar6,0));
        }
        else {
          bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar11,iVar6,&local_6a,SUB81(iVar6,0));
        }
        if (bVar19 != false) {
          bVar19 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<int>,true>
                             (&local_68,local_6a.result);
          goto LAB_00cee862;
        }
      }
    }
    else if (bVar1 == 0x20) goto LAB_00cef286;
  }
  goto LAB_00cee860;
  while( true ) {
    bVar1 = buf[uVar14 + uVar16] - 0x30;
    if (9 < bVar1) {
      if (buf[uVar14 + uVar16] != '.') goto LAB_00cef358;
      uVar13 = uVar16 + 1;
      if (uVar15 <= uVar13) {
        iVar4 = 3;
        uVar17 = uVar13;
        goto LAB_00cef331;
      }
      local_68.decimal = 0;
      uVar3 = uVar13;
      goto LAB_00cef16b;
    }
    uVar13 = uVar16 + 1;
    bVar19 = false;
    if (local_68.result <= (long)(((ulong)bVar1 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.result = local_68.result * 10 + (ulong)bVar1;
      bVar19 = true;
      if ((~uVar16 + len != uVar14) && (buf[uVar14 + 1 + uVar16] == '_')) {
        uVar13 = uVar16 + 2;
        if ((len - uVar16) - 2 == uVar14) {
          bVar19 = false;
        }
        else {
          bVar19 = (byte)(buf[uVar14 + uVar13] - 0x30U) < 10;
        }
      }
    }
    uVar16 = uVar13;
    if (!bVar19) break;
LAB_00ceedda:
    if (uVar15 <= uVar16) goto LAB_00cef064;
  }
  goto LAB_00cee860;
  while (uVar3 = uVar17, uVar17 < uVar15) {
LAB_00cef16b:
    bVar1 = buf[uVar14 + uVar3] - 0x30;
    local_38 = uVar13;
    if (9 < bVar1) {
      iVar4 = 0;
      goto LAB_00cef321;
    }
    if (local_68.decimal <= (long)(((ulong)bVar1 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.decimal_digits = local_68.decimal_digits + 1;
      local_68.decimal = local_68.decimal * 10 + (ulong)bVar1;
    }
    uVar17 = uVar3 + 1;
    if (((~uVar3 + len != uVar14) && (buf[uVar14 + 1 + uVar3] == '_')) &&
       ((uVar17 = uVar3 + 2, (len - uVar3) - 2 == uVar14 ||
        (9 < (byte)(buf[uVar14 + uVar17] - 0x30U))))) {
      local_68._18_6_ = 0;
      iVar7 = 1;
      goto LAB_00cef347;
    }
  }
  iVar4 = 3;
LAB_00cef321:
  local_68._18_6_ = 0;
  uVar17 = uVar3;
LAB_00cef331:
  iVar7 = 1;
  if (uVar13 < uVar17) {
    iVar7 = iVar4;
  }
  if (local_48 < uVar16) {
    iVar7 = iVar4;
  }
LAB_00cef347:
  uVar16 = uVar17;
  if (iVar7 == 3) {
LAB_00cef064:
    bVar19 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                       (&local_68);
    if (bVar19) {
      bVar19 = local_48 < uVar16;
      goto LAB_00cee862;
    }
  }
  else if (iVar7 == 0) {
LAB_00cef358:
    bVar1 = buf[uVar14 + uVar16];
    if (bVar1 - 9 < 5) {
LAB_00cef36a:
      uVar13 = uVar16 + 1;
      uVar16 = uVar13;
      if (uVar13 < uVar15) {
        do {
          if ((0x20 < (ulong)(byte)buf[uVar14 + uVar13]) ||
             ((0x100003e00U >> ((ulong)(byte)buf[uVar14 + uVar13] & 0x3f) & 1) == 0))
          goto LAB_00cee860;
          uVar13 = uVar13 + 1;
          uVar16 = uVar15;
        } while (uVar15 != uVar13);
      }
      goto LAB_00cef064;
    }
    if ((bVar1 == 0x65) || (bVar1 == 0x45)) {
      if ((uVar16 != local_48) && (uVar16 + 1 < uVar15)) {
        local_6a.result = 0;
        pcVar11 = buf + uVar14 + uVar16 + 1;
        iVar6 = ~uVar14 + (len - uVar16);
        if (*pcVar11 == '-') {
          bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar11,iVar6,&local_6a,SUB81(iVar6,0));
        }
        else {
          bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar11,iVar6,&local_6a,SUB81(iVar6,0));
        }
        if (bVar19 != false) {
          bVar19 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<int>,false>
                             (&local_68,local_6a.result);
          goto LAB_00cee862;
        }
      }
    }
    else if (bVar1 == 0x20) goto LAB_00cef36a;
  }
  goto LAB_00cee860;
LAB_00ceebe0:
  do {
    if (~uVar14 + len <= uVar15) {
      bVar19 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                         (&local_68);
      bVar19 = 1 < uVar15 && bVar19;
      goto LAB_00cee862;
    }
    bVar1 = buf[uVar14 + 1 + uVar15];
    bVar12 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar12 = bVar1;
    }
    if ((9 < (byte)(bVar12 - 0x30)) &&
       ((0x25 < bVar12 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar12 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar9 = -0x57;
    if ((char)bVar12 < 'a') {
      cVar9 = -0x30;
    }
    uVar16 = uVar15 + 1;
    if (((len - uVar15) - 2 == uVar14) || (buf[uVar14 + 2 + uVar15] != '_')) {
LAB_00ceecad:
      uVar15 = (ulong)((byte)(cVar9 + bVar12) >> 4) ^ 0x7ffffffffffffff;
      lVar2 = local_68.result;
      if (local_68.result <= (long)uVar15) {
        lVar2 = local_68.result * 0x10 + (ulong)(byte)(cVar9 + bVar12);
      }
      bVar19 = local_68.result <= (long)uVar15;
      local_68.result = lVar2;
    }
    else {
      uVar16 = uVar15 + 2;
      if ((len - uVar15) - 3 != uVar14) {
        if (9 < (byte)(buf[uVar14 + 3 + uVar15] - 0x30U)) {
          uVar10 = (byte)buf[uVar14 + 3 + uVar15] - 0x41;
          bVar19 = false;
          if ((0x25 < uVar10) ||
             (bVar19 = false, (0x3f0000003fU >> ((ulong)uVar10 & 0x3f) & 1) == 0))
          goto LAB_00ceecd4;
        }
        goto LAB_00ceecad;
      }
      bVar19 = false;
    }
LAB_00ceecd4:
    uVar15 = uVar16;
  } while (bVar19);
  goto LAB_00cee860;
  while( true ) {
    uVar16 = uVar3;
    if (0x3fffffffffffffff < local_68.result) goto LAB_00cee860;
    local_68.result = uVar13 + local_68.result * 2;
    if (uVar15 <= uVar16) break;
LAB_00cef0ac:
    if (buf[uVar14 + 1 + uVar16] == '0') {
      uVar13 = 0;
    }
    else {
      uVar13 = 1;
      if (buf[uVar14 + 1 + uVar16] != '1') goto LAB_00cee860;
    }
    uVar3 = uVar16 + 1;
    if (((len - uVar16) - 2 != uVar14) && (buf[uVar14 + 2 + uVar16] == '_')) {
      if (((len - uVar16) - 3 == uVar14) || ((buf[uVar14 + 3 + uVar16] & 0xfeU) != 0x30))
      goto LAB_00cee860;
      uVar3 = uVar16 + 2;
    }
  }
LAB_00cef126:
  bVar19 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                     (&local_68);
  bVar19 = bVar19 && 1 < uVar15;
  goto LAB_00cee862;
  while( true ) {
    uVar13 = uVar16 + 1;
    if (((len - uVar16) - 2 != uVar14) && (buf[uVar14 + 2 + uVar16] == '_')) {
      if (((len - uVar16) - 3 == uVar14) || ((buf[uVar14 + 3 + uVar16] & 0xfeU) != 0x30))
      goto LAB_00cef054;
      uVar13 = uVar16 + 2;
    }
    uVar16 = uVar13;
    if (0x3fffffff < iVar4) goto LAB_00cef054;
    iVar4 = iVar7 + iVar4 * 2;
    bVar19 = true;
    if (uVar15 <= uVar16) break;
LAB_00ceed10:
    iVar7 = 0;
    if (buf[uVar14 + 1 + uVar16] != '0') {
      if (buf[uVar14 + 1 + uVar16] != '1') goto LAB_00cef054;
      iVar7 = 1;
    }
  }
LAB_00cee829:
  if (bVar19) {
    *result = iVar4;
    bVar19 = true;
  }
  else {
    local_40 = result;
    if (len != 0) {
      uVar14 = 0;
      do {
        bVar1 = buf[uVar14];
        if ((0x20 < (ulong)bVar1) || ((0x100003e00U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
          local_68.result = 0;
          local_68.decimal = 0;
          local_68._16_8_ = 0;
          uVar15 = len - uVar14;
          local_68.decimal_digits = 0;
          if (bVar1 == 0x2d) {
            local_68.result = 0;
            uVar16 = 1;
            goto LAB_00ceeab9;
          }
          if (bVar1 != 0x30 || len - 1 == uVar14) {
LAB_00ceedc7:
            local_48 = (ulong)(bVar1 == 0x2b);
            local_68.result = 0;
            uVar16 = local_48;
            goto LAB_00ceedda;
          }
          cVar9 = buf[uVar14 + 1];
          if (cVar9 != 'B') {
            if (cVar9 != 'x') {
              if (cVar9 == 'b') goto LAB_00cef083;
              if (cVar9 != 'X') goto LAB_00ceedc7;
            }
            local_68.result = 0;
            uVar15 = 1;
            goto LAB_00ceebe0;
          }
LAB_00cef083:
          uVar15 = ~uVar14 + len;
          if (uVar15 < 2) goto LAB_00cef126;
          local_68.result = 0;
          uVar16 = 1;
          goto LAB_00cef0ac;
        }
        uVar14 = uVar14 + 1;
      } while (len != uVar14);
    }
LAB_00cee860:
    bVar19 = false;
LAB_00cee862:
    if (bVar19 != false) {
      *local_40 = (int)local_68.result;
    }
  }
  return bVar19;
}

Assistant:

static inline bool TrySimpleIntegerCast(const char *buf, idx_t len, T &result, bool strict) {
	IntegerCastData<T> simple_data;
	if (TryIntegerCast<IntegerCastData<T>, IS_SIGNED, false, IntegerCastOperation>(buf, len, simple_data, strict)) {
		result = (T)simple_data.result;
		return true;
	}

	// Simple integer cast failed, try again with decimals/exponents included
	// FIXME: This could definitely be improved as some extra work is being done here. It is more important that
	//  "normal" integers (without exponent/decimals) are still being parsed quickly.
	IntegerDecimalCastData<T> cast_data;
	if (TryIntegerCast<IntegerDecimalCastData<T>, IS_SIGNED, true, IntegerDecimalCastOperation>(buf, len, cast_data,
	                                                                                            strict)) {
		result = (T)cast_data.result;
		return true;
	}
	return false;
}